

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O0

void __thiscall AdaptorTest_StackTest_Test::TestBody(AdaptorTest_StackTest_Test *this)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  reference lhs;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  int i_1;
  int i;
  stack<int,_Deque<int,_std::allocator<int>_>_> s;
  bool *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 uVar4;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  stack<int,_Deque<int,_std::allocator<int>_>_> *in_stack_fffffffffffffee0;
  Type in_stack_fffffffffffffeec;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  string local_100 [32];
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  AssertionResult *in_stack_ffffffffffffff38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  int local_b8;
  int local_a4;
  
  std::stack<int,Deque<int,std::allocator<int>>>::stack<Deque<int,std::allocator<int>>,void>
            (in_stack_fffffffffffffee0);
  for (local_a4 = 0; local_a4 < 100; local_a4 = local_a4 + 1) {
    std::stack<int,_Deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_Deque<int,_std::allocator<int>_>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (value_type *)in_stack_fffffffffffffeb8);
  }
  for (local_b8 = 99; -1 < local_b8; local_b8 = local_b8 + -1) {
    uVar1 = std::stack<int,_Deque<int,_std::allocator<int>_>_>::empty
                      ((stack<int,_Deque<int,_std::allocator<int>_>_> *)0x17112c);
    bVar2 = ~uVar1 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8,(type *)0x171154);
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff38);
    uVar4 = bVar3;
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0.ptr_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff38,(char *)CONCAT17(bVar2,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffef0.ptr_,in_stack_fffffffffffffeec,
                 (char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                 (char *)CONCAT17(uVar1,CONCAT16(uVar4,in_stack_fffffffffffffed0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff40.ptr_,(Message *)in_stack_ffffffffffffff38
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      std::__cxx11::string::~string(local_100);
      testing::Message::~Message((Message *)0x17121f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17129e);
    if (!bVar3) break;
    lhs = std::stack<int,_Deque<int,_std::allocator<int>_>_>::top
                    ((stack<int,_Deque<int,_std::allocator<int>_>_> *)0x1712b9);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char *)CONCAT17(uVar1,CONCAT16(uVar4,in_stack_fffffffffffffed0)),lhs,
               (int *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    bVar3 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffee8);
    in_stack_fffffffffffffec7 = bVar3;
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0.ptr_);
      in_stack_fffffffffffffeb8 =
           (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x171347);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffef0.ptr_,in_stack_fffffffffffffeec,
                 (char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                 (char *)CONCAT17(uVar1,CONCAT16(uVar4,in_stack_fffffffffffffed0)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff40.ptr_,(Message *)in_stack_ffffffffffffff38
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      testing::Message::~Message((Message *)0x171393);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1713ef);
    if (!bVar3) break;
    std::stack<int,_Deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_Deque<int,_std::allocator<int>_>_> *)0x171406);
  }
  std::stack<int,_Deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_Deque<int,_std::allocator<int>_>_> *)0x171441);
  return;
}

Assistant:

TEST(AdaptorTest, StackTest) {
    std::stack<int, Deque<int>> s;
    for (int i = 0; i < 100; ++i) {
        s.push(i);
    }

    for (int i = 99; i >= 0; --i) {
        ASSERT_FALSE(s.empty());
        ASSERT_EQ(s.top(), i);
        s.pop();
    }
}